

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_append_text_utf8(nk_str *str,char *text,int len)

{
  int iVar1;
  int in_EDX;
  nk_str *in_RSI;
  nk_rune *in_RDI;
  nk_rune unicode;
  int byte_len;
  int i;
  int len_00;
  int iVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  len_00 = 0;
  if (((in_RDI == (nk_rune *)0x0) || (in_RSI == (nk_str *)0x0)) || (in_EDX == 0)) {
    in_EDX = 0;
  }
  else {
    for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
      iVar1 = nk_utf_decode((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI,(int)((ulong)in_RSI >> 0x20));
      len_00 = iVar1 + len_00;
    }
    nk_str_append_text_char(in_RSI,(char *)CONCAT44(in_EDX,iVar2),len_00);
  }
  return in_EDX;
}

Assistant:

NK_API int
nk_str_append_text_utf8(struct nk_str *str, const char *text, int len)
{
int i = 0;
int byte_len = 0;
nk_rune unicode;
if (!str || !text || !len) return 0;
for (i = 0; i < len; ++i)
byte_len += nk_utf_decode(text+byte_len, &unicode, 4);
nk_str_append_text_char(str, text, byte_len);
return len;
}